

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Instance::Instance(Instance *this,Store *store,Ref module)

{
  bool bVar1;
  Store *store_local;
  Instance *this_local;
  Ref module_local;
  
  Object::Object(&this->super_Object,Instance);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Instance_005ba088;
  (this->module_).index = module.index;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->imports_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->funcs_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->tables_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->memories_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->globals_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->events_);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector(&this->exports_);
  std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::vector
            (&this->elems_);
  std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>::vector
            (&this->datas_);
  bVar1 = Store::Is<wabt::interp::Module>(store,module);
  if (!bVar1) {
    __assert_fail("store.Is<Module>(module)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                  ,0x2cb,"wabt::interp::Instance::Instance(Store &, Ref)");
  }
  return;
}

Assistant:

Instance::Instance(Store& store, Ref module) : Object(skind), module_(module) {
  assert(store.Is<Module>(module));
}